

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall
FxActionSpecialCall::Resolve(FxActionSpecialCall *this,FCompileContext *ctx)

{
  bool bVar1;
  FxExpression *pFVar2;
  PType *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxExpression *pFVar5;
  undefined4 extraout_var_01;
  ulong uVar6;
  char *message;
  bool bVar7;
  ulong uVar9;
  bool bVar8;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar2 = this->Self;
  if (pFVar2 == (FxExpression *)0x0) {
LAB_005369fb:
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) {
      bVar8 = false;
      bVar7 = false;
      uVar9 = 0;
      do {
        pFVar2 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar9];
        iVar4 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
        (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar9] =
             (FxExpression *)CONCAT44(extraout_var_00,iVar4);
        pFVar2 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar9];
        if (pFVar2 == (FxExpression *)0x0) {
LAB_00536b51:
          bVar7 = true;
          bVar8 = true;
        }
        else {
          pPVar3 = pFVar2->ValueType;
          if ((uVar9 == 0) && (this->Special < 0)) {
            if (pPVar3 == (PType *)TypeString) {
              pFVar5 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x30);
              pFVar2 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
              pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
              FScriptPosition::FScriptPosition(&pFVar5->ScriptPosition,&pFVar2->ScriptPosition);
              pFVar5->ValueType = (PType *)0x0;
              pFVar5->isresolved = false;
              pFVar5->NeedResult = true;
              pFVar5->ExprType = EFX_NameCast;
              pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxNameCast_0070f680;
              pFVar5[1]._vptr_FxExpression = (_func_int **)pFVar2;
              pFVar5->ValueType = (PType *)TypeName;
              *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = pFVar5;
              pFVar2 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
              iVar4 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
              *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array =
                   (FxExpression *)CONCAT44(extraout_var_01,iVar4);
              bVar7 = bVar8;
              if (*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array ==
                  (FxExpression *)0x0) {
                bVar7 = true;
                bVar8 = bVar7;
              }
            }
            else if (pPVar3 != (PType *)TypeName) {
              message = "Name expected for parameter %d";
              uVar6 = 0;
LAB_00536b4a:
              FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,uVar6);
              goto LAB_00536b51;
            }
          }
          else {
            iVar4 = (*(((PBasicType *)&pPVar3->super_PTypeBase)->super_PType).super_PTypeBase.
                      super_DObject._vptr_DObject[8])();
            if (((char)iVar4 == '\0') || (pFVar2->ValueType->RegType != '\0')) {
              if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar9]->
                  ValueType->RegType != '\x01') {
                message = "Integer expected for parameter %d";
                uVar6 = uVar9 & 0xffffffff;
                goto LAB_00536b4a;
              }
              pFVar5 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
              pFVar2 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar9];
              bVar1 = ctx->FromDecorate;
              pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
              FScriptPosition::FScriptPosition(&pFVar5->ScriptPosition,&pFVar2->ScriptPosition);
              pFVar5->ValueType = (PType *)0x0;
              pFVar5->isresolved = false;
              pFVar5->NeedResult = true;
              pFVar5->ExprType = EFX_IntCast;
              pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxIntCast_0070f5b0;
              pFVar5[1]._vptr_FxExpression = (_func_int **)pFVar2;
              pFVar5->ValueType = (PType *)TypeSInt32;
              *(bool *)&pFVar5[1].ScriptPosition.FileName.Chars = bVar1;
              *(undefined1 *)((long)&pFVar5[1].ScriptPosition.FileName.Chars + 1) = 0;
              (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar9] = pFVar5;
            }
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count);
      if (bVar7) goto LAB_00536c10;
    }
    (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
  }
  else {
    iVar4 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar4);
    if ((FxExpression *)CONCAT44(extraout_var,iVar4) != (FxExpression *)0x0) goto LAB_005369fb;
LAB_00536c10:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxActionSpecialCall *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxActionSpecialCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	bool failed = false;

	SAFE_RESOLVE_OPT(Self, ctx);
	for (unsigned i = 0; i < ArgList.Size(); i++)
	{
		ArgList[i] = ArgList[i]->Resolve(ctx);
		if (ArgList[i] == nullptr)
		{
			failed = true;
		}
		else if (Special < 0 && i == 0)
		{
			if (ArgList[i]->ValueType == TypeString)
			{
				ArgList[i] = new FxNameCast(ArgList[i]);
				ArgList[i] = ArgList[i]->Resolve(ctx);
				if (ArgList[i] == nullptr)
				{
					failed = true;
				}
			}
			else if (ArgList[i]->ValueType != TypeName)
			{
				ScriptPosition.Message(MSG_ERROR, "Name expected for parameter %d", i);
				failed = true;
			}
		}
		else if (!ArgList[i]->IsInteger())
		{
			if (ArgList[i]->ValueType->GetRegType() == REGT_FLOAT /* lax */)
			{
				ArgList[i] = new FxIntCast(ArgList[i], ctx.FromDecorate);
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Integer expected for parameter %d", i);
				failed = true;
			}
		}
	}
	if (failed)
	{
		delete this;
		return nullptr;
	}
	ValueType = TypeSInt32;
	return this;
}